

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O0

Lazy<cinatra::resp_data> __thiscall
cinatra::coro_http_client::write_websocket(coro_http_client *this,string *data,opcode op)

{
  bool bVar1;
  undefined8 *puVar2;
  undefined8 *extraout_RAX;
  undefined8 *extraout_RAX_00;
  undefined1 in_CL;
  undefined8 in_RDX;
  undefined8 in_RSI;
  LazyBase<cinatra::resp_data,_false> in_RDI;
  opcode in_stack_000001af;
  coro_http_client *in_stack_000001b0;
  span<char,_18446744073709551615UL> in_stack_000001b8;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  span<char,_18446744073709551615UL> *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  int iVar3;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  
  puVar2 = (undefined8 *)operator_new(0xe8,(nothrow_t *)&std::nothrow);
  if (puVar2 == (undefined8 *)0x0) {
    async_simple::coro::detail::LazyPromise<cinatra::resp_data>::
    get_return_object_on_allocation_failure();
  }
  else {
    *puVar2 = write_websocket;
    puVar2[1] = write_websocket;
    puVar2[0x1b] = in_RSI;
    puVar2[0x17] = in_RDX;
    *(undefined1 *)((long)puVar2 + 0xe5) = in_CL;
    async_simple::coro::detail::LazyPromise<cinatra::resp_data>::LazyPromise
              ((LazyPromise<cinatra::resp_data> *)
               CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    async_simple::coro::detail::LazyPromise<cinatra::resp_data>::get_return_object
              ((LazyPromise<cinatra::resp_data> *)
               CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    async_simple::coro::detail::LazyPromiseBase::initial_suspend((LazyPromiseBase *)(puVar2 + 2));
    bVar1 = std::suspend_always::await_ready((suspend_always *)((long)puVar2 + 0xe6));
    if (bVar1) {
      std::suspend_always::await_resume((suspend_always *)((long)puVar2 + 0xe6));
      std::span<char,_18446744073709551615UL>::
      span<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                (in_stack_fffffffffffffe20,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      write_websocket<std::span<char,18446744073709551615ul>>
                (in_stack_000001b0,in_stack_000001b8,in_stack_000001af);
      async_simple::coro::detail::LazyPromiseBase::
      await_transform<async_simple::coro::Lazy<cinatra::resp_data>>
                ((LazyPromiseBase *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                 (Lazy<cinatra::resp_data> *)
                 CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
      bVar1 = async_simple::coro::detail::LazyAwaiterBase<cinatra::resp_data>::await_ready
                        ((LazyAwaiterBase<cinatra::resp_data> *)(puVar2 + 0x18));
      if (bVar1) {
        puVar2[0x16] = (LazyAwaiterBase<cinatra::resp_data> *)(puVar2 + 0x18);
        async_simple::coro::detail::LazyAwaiterBase<cinatra::resp_data>::awaitResume
                  ((LazyAwaiterBase<cinatra::resp_data> *)
                   CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
        async_simple::coro::detail::LazyPromise<cinatra::resp_data>::
        return_value<cinatra::resp_data>
                  ((LazyPromise<cinatra::resp_data> *)
                   CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                   (resp_data *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        iVar3 = 0;
        async_simple::coro::detail::LazyBase<cinatra::resp_data,_false>::ValueAwaiter::~ValueAwaiter
                  ((ValueAwaiter *)0x4396c0);
        async_simple::coro::Lazy<cinatra::resp_data>::~Lazy((Lazy<cinatra::resp_data> *)0x4396cd);
        if (iVar3 == 0) {
          async_simple::coro::detail::LazyPromiseBase::final_suspend
                    ((LazyPromiseBase *)(puVar2 + 2));
          bVar1 = async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_ready
                            ((FinalAwaiter *)((long)puVar2 + 0xe7));
          if (!bVar1) {
            *puVar2 = 0;
            *(undefined1 *)((long)puVar2 + 0xe4) = 2;
            write_websocket(in_stack_fffffffffffffe20,
                            (void *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
            (*(code *)*extraout_RAX_00)(extraout_RAX_00);
            return (Lazy<cinatra::resp_data>)in_RDI._coro.__handle_.__handle_;
          }
          async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_resume
                    ((FinalAwaiter *)((long)puVar2 + 0xe7));
        }
        async_simple::coro::detail::LazyPromise<cinatra::resp_data>::~LazyPromise
                  ((LazyPromise<cinatra::resp_data> *)0x439841);
        if (puVar2 != (undefined8 *)0x0) {
          operator_delete(puVar2,0xe8);
        }
      }
      else {
        *(undefined1 *)((long)puVar2 + 0xe4) = 1;
        write_websocket((void *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                        (void *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        (*(code *)*extraout_RAX)(extraout_RAX);
      }
    }
    else {
      *(undefined1 *)((long)puVar2 + 0xe4) = 0;
      write_websocket(in_stack_fffffffffffffe20,
                      (void *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    }
  }
  return (Lazy<cinatra::resp_data>)in_RDI._coro.__handle_;
}

Assistant:

async_simple::coro::Lazy<resp_data> write_websocket(
      std::string &&data, opcode op = opcode::text) {
    co_return co_await write_websocket(std::span<char>(data), op);
  }